

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# border_offset.cpp
# Opt level: O2

size_t cppurses::detail::Border_offset::west(Widget *w)

{
  if (((w->border).enabled_ == true) && (1 < w->outer_width_)) {
    if ((w->border).segments.west.enabled_ != false) {
      return 1;
    }
    if ((w->border).segments.north_west.enabled_ != false) {
      return 1;
    }
    if ((w->border).segments.south_west.enabled_ != false) {
      return 1;
    }
  }
  return 0;
}

Assistant:

std::size_t Border_offset::west(const Widget& w) {
    const auto& b = w.border.segments;
    if (w.border.enabled() && !west_disqualified(w) &&
        (b.west.enabled() || b.north_west.enabled() ||
         b.south_west.enabled())) {
        return 1;
    }
    return 0;
}